

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basicTests.cpp
# Opt level: O0

void __thiscall
TEST_ClassName_stdOutMessesWithOutputAndFails_Test::testBody
          (TEST_ClassName_stdOutMessesWithOutputAndFails_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  int out;
  undefined8 in_stack_ffffffffffffff78;
  int value;
  
  value = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  printf("This will appear in the output");
  pUVar1 = UtestShell::getCurrent();
  StringFrom(value);
  pcVar2 = SimpleString::asCharString((SimpleString *)0x10bc8a);
  StringFrom(value);
  pcVar3 = SimpleString::asCharString((SimpleString *)0x10bcab);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x16])
            (pUVar1,1,pcVar2,pcVar3,0,
             "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/test/basicTests.cpp"
             ,0x41,pTVar4);
  SimpleString::~SimpleString((SimpleString *)0x10bd09);
  SimpleString::~SimpleString((SimpleString *)0x10bd13);
  return;
}

Assistant:

TEST(ClassName, stdOutMessesWithOutputAndFails)
{
  printf("This will appear in the output");
  int out = 24 + 74;
  CHECK_EQUAL(17, out);
}